

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O1

int64_t dist_block_px_domain
                  (AV1_COMP *cpi,MACROBLOCK *x,int plane,BLOCK_SIZE plane_bsize,int block,
                  int blk_row,int blk_col,TX_SIZE tx_size)

{
  _Bool _Var1;
  int iVar2;
  int a_stride;
  tran_low_t *ptVar3;
  MB_MODE_INFO *pMVar4;
  _func_void_uint8_t_ptr_ptrdiff_t_uint8_t_ptr_ptrdiff_t_int_int **pp_Var5;
  byte *pbVar6;
  uint64_t uVar7;
  byte bVar8;
  TX_TYPE tx_type;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint16_t *puVar12;
  uint8_t *a;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  char cVar16;
  uint16_t *local_2088;
  int txb_width;
  uint sse;
  ulong local_2068;
  AV1_COMP *local_2060;
  ulong local_2058;
  macroblockd_plane *local_2050;
  ulong local_2048;
  uint8_t *local_2040;
  uint16_t recon16 [4096];
  
  ptVar3 = x->plane[plane].dqcoeff;
  local_2048 = (ulong)x->plane[plane].eobs[block];
  local_2068 = (ulong)tx_size;
  local_2058 = (ulong)txsize_to_bsize[local_2068];
  iVar2 = (x->e_mbd).plane[plane].dst.stride;
  a_stride = x->plane[plane].src.stride;
  local_2040 = x->plane[plane].src.buf;
  puVar12 = (uint16_t *)((x->e_mbd).plane[plane].dst.buf + (iVar2 * blk_row + blk_col) * 4);
  uVar13 = (uint)block_size_wide[local_2058];
  uVar15 = (uint)block_size_high[local_2058];
  if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
    pp_Var5 = &aom_convolve_copy;
    local_2088 = recon16;
  }
  else {
    local_2088 = (uint16_t *)((ulong)recon16 >> 1);
    puVar12 = (uint16_t *)((long)puVar12 * 2);
    pp_Var5 = (_func_void_uint8_t_ptr_ptrdiff_t_uint8_t_ptr_ptrdiff_t_int_int **)
              &aom_highbd_convolve_copy;
  }
  (**pp_Var5)(puVar12,(long)iVar2,recon16,0x40,uVar13,uVar15);
  local_2050 = (x->e_mbd).plane;
  _Var1 = (cpi->common).features.reduced_tx_set_used;
  pMVar4 = *(x->e_mbd).mi;
  if (((x->e_mbd).lossless[*(ushort *)&pMVar4->field_0xa7 & 7] == 0) &&
     ((0x61810UL >> (local_2068 & 0x3f) & 1) == 0)) {
    if (plane == 0) {
      tx_type = (x->e_mbd).tx_type_map[(x->e_mbd).tx_type_map_stride * blk_row + blk_col];
    }
    else {
      cVar16 = (char)*(ushort *)&pMVar4->field_0xa7;
      if ((cVar16 < '\0') || ('\0' < pMVar4->ref_frame[0])) {
        pbVar6 = (x->e_mbd).tx_type_map +
                 ((blk_row << ((byte)(x->e_mbd).plane[plane != 0].subsampling_y & 0x1f)) *
                  (x->e_mbd).tx_type_map_stride +
                 (blk_col << ((byte)(x->e_mbd).plane[plane != 0].subsampling_x & 0x1f)));
      }
      else {
        pbVar6 = intra_mode_to_tx_type__intra_mode_to_tx_type +
                 (byte)get_uv_mode_uv2y[pMVar4->uv_mode];
      }
      uVar9 = 1;
      if (-1 < cVar16) {
        uVar9 = (uint)('\0' < pMVar4->ref_frame[0]);
      }
      if ((0x18608UL >> (local_2068 & 0x3f) & 1) == 0) {
        if (_Var1 == false) {
          uVar9 = (uint)av1_ext_tx_set_lookup[0]
                        [(ulong)((0x60604UL >> (local_2068 & 0x3f) & 1) != 0) + (ulong)(uVar9 * 2)];
        }
        else {
          uVar9 = (uint)(byte)((uVar9 == 0) + 1);
        }
      }
      uVar9 = *(uint *)((long)av1_ext_tx_used[0] + (ulong)*pbVar6 * 4 + (ulong)(uVar9 << 6));
      if (uVar9 != 0) {
        uVar9 = (uint)*pbVar6;
      }
      tx_type = (TX_TYPE)uVar9;
    }
  }
  else {
    tx_type = '\0';
  }
  local_2060 = cpi;
  av1_inverse_transform_block
            (&x->e_mbd,ptVar3 + (block << 4),plane,tx_type,(TX_SIZE)local_2068,(uint8_t *)local_2088
             ,0x40,(int)local_2048,(uint)_Var1);
  iVar2 = (x->e_mbd).mb_to_bottom_edge;
  uVar9 = uVar15;
  if (iVar2 < 0) {
    uVar10 = (uint)block_size_high[plane_bsize] + blk_row * -4 +
             (iVar2 >> ((char)local_2050[plane].subsampling_y + 3U & 0x1f));
    uVar14 = uVar15;
    if ((int)uVar10 < (int)uVar15) {
      uVar14 = uVar10;
    }
    uVar9 = 0;
    if (-1 < (int)uVar10) {
      uVar9 = uVar14;
    }
  }
  iVar2 = (x->e_mbd).mb_to_right_edge;
  uVar14 = uVar13;
  if (iVar2 < 0) {
    uVar11 = (uint)block_size_wide[plane_bsize] + blk_col * -4 +
             (iVar2 >> ((char)local_2050[plane].subsampling_x + 3U & 0x1f));
    uVar10 = uVar13;
    if ((int)uVar11 < (int)uVar13) {
      uVar10 = uVar11;
    }
    uVar14 = 0;
    if (-1 < (int)uVar11) {
      uVar14 = uVar10;
    }
  }
  a = local_2040 + (a_stride * blk_row + blk_col) * 4;
  if ((uVar9 == uVar15) && (uVar14 == uVar13)) {
    (*local_2060->ppi->fn_ptr[local_2058].vf)(a,a_stride,(uint8_t *)local_2088,0x40,&sse);
  }
  else if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
    sse = aom_sse_odd_size(a,a_stride,(uint8_t *)local_2088,0x40,uVar14,uVar9);
  }
  else {
    uVar7 = aom_highbd_sse_odd_size(a,a_stride,(uint8_t *)local_2088,0x40,uVar14,uVar9);
    bVar8 = (char)(x->e_mbd).bd * '\x02' - 0x10;
    sse = (uint)(((uint)(1 << (bVar8 & 0x1f)) >> 1) + uVar7 >> (bVar8 & 0x3f));
  }
  return (ulong)(sse << 4);
}

Assistant:

static inline int64_t dist_block_px_domain(const AV1_COMP *cpi, MACROBLOCK *x,
                                           int plane, BLOCK_SIZE plane_bsize,
                                           int block, int blk_row, int blk_col,
                                           TX_SIZE tx_size) {
  MACROBLOCKD *const xd = &x->e_mbd;
  const struct macroblock_plane *const p = &x->plane[plane];
  const uint16_t eob = p->eobs[block];
  const BLOCK_SIZE tx_bsize = txsize_to_bsize[tx_size];
  const int bsw = block_size_wide[tx_bsize];
  const int bsh = block_size_high[tx_bsize];
  const int src_stride = x->plane[plane].src.stride;
  const int dst_stride = xd->plane[plane].dst.stride;
  // Scale the transform block index to pixel unit.
  const int src_idx = (blk_row * src_stride + blk_col) << MI_SIZE_LOG2;
  const int dst_idx = (blk_row * dst_stride + blk_col) << MI_SIZE_LOG2;
  const uint8_t *src = &x->plane[plane].src.buf[src_idx];
  const uint8_t *dst = &xd->plane[plane].dst.buf[dst_idx];
  const tran_low_t *dqcoeff = p->dqcoeff + BLOCK_OFFSET(block);

  assert(cpi != NULL);
  assert(tx_size_wide_log2[0] == tx_size_high_log2[0]);

  uint8_t *recon;
  DECLARE_ALIGNED(16, uint16_t, recon16[MAX_TX_SQUARE]);

#if CONFIG_AV1_HIGHBITDEPTH
  if (is_cur_buf_hbd(xd)) {
    recon = CONVERT_TO_BYTEPTR(recon16);
    aom_highbd_convolve_copy(CONVERT_TO_SHORTPTR(dst), dst_stride,
                             CONVERT_TO_SHORTPTR(recon), MAX_TX_SIZE, bsw, bsh);
  } else {
    recon = (uint8_t *)recon16;
    aom_convolve_copy(dst, dst_stride, recon, MAX_TX_SIZE, bsw, bsh);
  }
#else
  recon = (uint8_t *)recon16;
  aom_convolve_copy(dst, dst_stride, recon, MAX_TX_SIZE, bsw, bsh);
#endif

  const PLANE_TYPE plane_type = get_plane_type(plane);
  TX_TYPE tx_type = av1_get_tx_type(xd, plane_type, blk_row, blk_col, tx_size,
                                    cpi->common.features.reduced_tx_set_used);
  av1_inverse_transform_block(xd, dqcoeff, plane, tx_type, tx_size, recon,
                              MAX_TX_SIZE, eob,
                              cpi->common.features.reduced_tx_set_used);

  return 16 * pixel_dist(cpi, x, plane, src, src_stride, recon, MAX_TX_SIZE,
                         blk_row, blk_col, plane_bsize, tx_bsize);
}